

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O3

bool dxil_spv::wmma_store_is_masked(Impl *impl,StoreInst *inst)

{
  iterator iVar1;
  UnorderedMap<const_LLVMBC::Value_*,_AGSCoopMatMapping> *this;
  Value *local_20;
  
  this = &(impl->ags).coopmat_component_mapping;
  local_20 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,0);
  iVar1 = std::
          _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->_M_h,&local_20);
  if ((iVar1.
       super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(int *)((long)iVar1.
                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                     ._M_cur + 0x14) != 0)) {
    local_20 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
    iVar1 = std::
            _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this->_M_h,&local_20);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
        ._M_cur != (__node_type *)0x0) {
      return *(int *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                            ._M_cur + 0x14) != 0;
    }
  }
  return false;
}

Assistant:

bool wmma_store_is_masked(Converter::Impl &impl, const llvm::StoreInst *inst)
{
	auto itr = impl.ags.coopmat_component_mapping.find(inst->getOperand(0));
	if (itr == impl.ags.coopmat_component_mapping.end() || itr->second.component == 0)
		return false;

	itr = impl.ags.coopmat_component_mapping.find(inst->getOperand(1));
	if (itr == impl.ags.coopmat_component_mapping.end() || itr->second.component == 0)
		return false;

	return true;
}